

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * json_value_init_null(void)

{
  JSON_Value *new_value;
  JSON_Value *local_8;
  
  local_8 = (JSON_Value *)(*parson_malloc)(0x20);
  if (local_8 == (JSON_Value *)0x0) {
    local_8 = (JSON_Value *)0x0;
  }
  else {
    local_8->parent = (JSON_Value *)0x0;
    local_8->type = 1;
  }
  return local_8;
}

Assistant:

JSON_Value * json_value_init_null(void) {
    JSON_Value *new_value = (JSON_Value*)parson_malloc(sizeof(JSON_Value));
    if (!new_value) {
        return NULL;
    }
    new_value->parent = NULL;
    new_value->type = JSONNull;
    return new_value;
}